

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::ModuleHeaderSyntax::setChild
          (ModuleHeaderSyntax *this,size_t index,TokenOrSyntax child)

{
  size_type sVar1;
  ParameterPortListSyntax *pPVar2;
  SyntaxList<slang::syntax::PackageImportDeclarationSyntax> *pSVar3;
  SyntaxNode *pSVar4;
  PortListSyntax *pPVar5;
  logic_error *this_00;
  Token TVar6;
  allocator<char> local_d9;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (index < 7) {
    switch(index) {
    case 0:
      TVar6 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
      (this->moduleKeyword).kind = TVar6.kind;
      (this->moduleKeyword).field_0x2 = TVar6._2_1_;
      (this->moduleKeyword).numFlags = (NumericTokenFlags)TVar6.numFlags.raw;
      (this->moduleKeyword).rawLen = TVar6.rawLen;
      (this->moduleKeyword).info = TVar6.info;
      break;
    case 1:
      TVar6 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
      (this->lifetime).kind = TVar6.kind;
      (this->lifetime).field_0x2 = TVar6._2_1_;
      (this->lifetime).numFlags = (NumericTokenFlags)TVar6.numFlags.raw;
      (this->lifetime).rawLen = TVar6.rawLen;
      (this->lifetime).info = TVar6.info;
      break;
    case 2:
      TVar6 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
      (this->name).kind = TVar6.kind;
      (this->name).field_0x2 = TVar6._2_1_;
      (this->name).numFlags = (NumericTokenFlags)TVar6.numFlags.raw;
      (this->name).rawLen = TVar6.rawLen;
      (this->name).info = TVar6.info;
      break;
    case 3:
      pSVar4 = TokenOrSyntax::node(&child);
      pSVar3 = SyntaxNode::
               as<slang::syntax::SyntaxList<slang::syntax::PackageImportDeclarationSyntax>>(pSVar4);
      (this->imports).super_SyntaxListBase.super_SyntaxNode.parent =
           (pSVar3->super_SyntaxListBase).super_SyntaxNode.parent;
      (this->imports).super_SyntaxListBase.super_SyntaxNode.kind =
           (pSVar3->super_SyntaxListBase).super_SyntaxNode.kind;
      (this->imports).super_SyntaxListBase.childCount = (pSVar3->super_SyntaxListBase).childCount;
      sVar1 = (pSVar3->
              super_span<slang::syntax::PackageImportDeclarationSyntax_*,_18446744073709551615UL>).
              size_;
      (this->imports).
      super_span<slang::syntax::PackageImportDeclarationSyntax_*,_18446744073709551615UL>.data_ =
           (pSVar3->
           super_span<slang::syntax::PackageImportDeclarationSyntax_*,_18446744073709551615UL>).
           data_;
      (this->imports).
      super_span<slang::syntax::PackageImportDeclarationSyntax_*,_18446744073709551615UL>.size_ =
           sVar1;
      break;
    case 4:
      pSVar4 = TokenOrSyntax::node(&child);
      if (pSVar4 == (SyntaxNode *)0x0) {
        pPVar2 = (ParameterPortListSyntax *)0x0;
      }
      else {
        pSVar4 = TokenOrSyntax::node(&child);
        pPVar2 = SyntaxNode::as<slang::syntax::ParameterPortListSyntax>(pSVar4);
      }
      this->parameters = pPVar2;
      break;
    case 5:
      pSVar4 = TokenOrSyntax::node(&child);
      if (pSVar4 == (SyntaxNode *)0x0) {
        pPVar5 = (PortListSyntax *)0x0;
      }
      else {
        pSVar4 = TokenOrSyntax::node(&child);
        pPVar5 = SyntaxNode::as<slang::syntax::PortListSyntax>(pSVar4);
      }
      this->ports = pPVar5;
      break;
    case 6:
      TVar6 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
      (this->semi).kind = TVar6.kind;
      (this->semi).field_0x2 = TVar6._2_1_;
      (this->semi).numFlags = (NumericTokenFlags)TVar6.numFlags.raw;
      (this->semi).rawLen = TVar6.rawLen;
      (this->semi).info = TVar6.info;
    }
    return;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O2/extern/slang/source/AllSyntax.cpp"
             ,&local_d9);
  std::operator+(&local_98,&local_b8,":");
  std::__cxx11::to_string(&local_d8,0x213e);
  std::operator+(&local_78,&local_98,&local_d8);
  std::operator+(&local_58,&local_78,": ");
  std::operator+(&local_38,&local_58,"Default case should be unreachable!");
  std::logic_error::logic_error(this_00,(string *)&local_38);
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void ModuleHeaderSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: moduleKeyword = child.token(); return;
        case 1: lifetime = child.token(); return;
        case 2: name = child.token(); return;
        case 3: imports = child.node()->as<SyntaxList<PackageImportDeclarationSyntax>>(); return;
        case 4: parameters = child.node() ? &child.node()->as<ParameterPortListSyntax>() : nullptr; return;
        case 5: ports = child.node() ? &child.node()->as<PortListSyntax>() : nullptr; return;
        case 6: semi = child.token(); return;
        default: ASSUME_UNREACHABLE;
    }
}